

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

MIR_item_t_conflict
new_proto(MIR_context_t ctx,char *name,size_t nres,MIR_type_t *res_types,size_t nargs,int vararg_p,
         __va_list_tag *argp)

{
  long lVar1;
  MIR_item_t_conflict pMVar2;
  size_t sVar3;
  ulong uVar4;
  undefined8 *puVar5;
  uint uVar6;
  undefined4 *puVar7;
  undefined8 *puVar8;
  bool bVar9;
  undefined8 auStack_40 [3];
  
  uVar4 = nargs * 0x18 + 0xf & 0xfffffffffffffff0;
  lVar1 = -uVar4;
  puVar5 = (undefined8 *)(&stack0xffffffffffffffe0 + -uVar4);
  sVar3 = nargs;
  while (bVar9 = sVar3 != 0, sVar3 = sVar3 - 1, bVar9) {
    uVar4 = (ulong)argp->gp_offset;
    if (uVar4 < 0x29) {
      puVar7 = (undefined4 *)(uVar4 + (long)argp->reg_save_area);
      uVar6 = argp->gp_offset + 8;
      uVar4 = (ulong)uVar6;
      argp->gp_offset = uVar6;
    }
    else {
      puVar7 = (undefined4 *)argp->overflow_arg_area;
      argp->overflow_arg_area = puVar7 + 2;
    }
    *(undefined4 *)(puVar5 + -1) = *puVar7;
    if ((uint)uVar4 < 0x29) {
      puVar8 = (undefined8 *)(uVar4 + (long)argp->reg_save_area);
      argp->gp_offset = (uint)uVar4 + 8;
    }
    else {
      puVar8 = (undefined8 *)argp->overflow_arg_area;
      argp->overflow_arg_area = puVar8 + 1;
    }
    *puVar5 = *puVar8;
    puVar5 = puVar5 + 3;
  }
  *(undefined1 **)((long)auStack_40 + lVar1 + 8) = &stack0xffffffffffffffd8 + lVar1;
  *(undefined8 *)((long)auStack_40 + lVar1) = 0x110e30;
  pMVar2 = new_proto_arr(ctx,name,nres,res_types,nargs,vararg_p,
                         *(MIR_var_t **)((long)auStack_40 + lVar1 + 8));
  return pMVar2;
}

Assistant:

static MIR_item_t new_proto (MIR_context_t ctx, const char *name, size_t nres,
                             MIR_type_t *res_types, size_t nargs, int vararg_p, va_list argp) {
  MIR_var_t *args = alloca (nargs * sizeof (MIR_var_t));
  size_t i;

  for (i = 0; i < nargs; i++) {
    args[i].type = va_arg (argp, MIR_type_t);
    args[i].name = va_arg (argp, const char *);
  }
  return new_proto_arr (ctx, name, nres, res_types, nargs, vararg_p, args);
}